

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O1

void __thiscall C3DFile::readParameterSection(C3DFile *this,ifstream *datastream)

{
  byte bVar1;
  pointer pGVar2;
  pointer pGVar3;
  bool bVar4;
  bool bVar5;
  mapped_type_conflict *pmVar6;
  C3DFile *this_00;
  Sint8 peek_buffer [2];
  ParameterHeader pheader;
  ParameterInfo param_info;
  undefined1 local_ae;
  char local_ad;
  int local_ac;
  ifstream *local_a8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_a0;
  vector<GroupInfo,_std::allocator<GroupInfo>_> *local_98;
  vector<ParameterInfo,_std::allocator<ParameterInfo>_> *local_90;
  undefined1 local_84 [4];
  ParameterInfo local_80;
  
  bVar1 = (this->header).first_parameter;
  if (1 < bVar1) {
    std::istream::seekg(datastream,(uint)bVar1 * 0x200 + -0x200,0);
    std::istream::read((char *)datastream,(long)local_84);
    local_90 = &this->param_infos;
    local_98 = &this->group_infos;
    local_a0 = &this->group_id_to_index_map;
    bVar5 = true;
    bVar4 = true;
    local_a8 = datastream;
    do {
      std::istream::read((char *)datastream,(long)&local_ae);
      this_00 = (C3DFile *)0xfffffffffffffffe;
      std::istream::seekg((long)datastream,~_S_cur);
      if (local_ad < '\0') {
        readGroupInfo((GroupInfo *)&local_80,this_00,datastream);
        std::vector<GroupInfo,_std::allocator<GroupInfo>_>::push_back
                  (local_98,(value_type *)&local_80);
        pGVar2 = (this->group_infos).super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pGVar3 = (this->group_infos).super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        local_ac = -(int)local_80.group_id;
        pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](local_a0,&local_ac);
        *pmVar6 = (int)((ulong)((long)pGVar3 - (long)pGVar2) >> 3) * -0x33333333 + -1;
        GroupInfo::~GroupInfo((GroupInfo *)&local_80);
        datastream = local_a8;
      }
      else {
        readParameterInfo(&local_80,this_00,datastream);
        std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>::push_back(local_90,&local_80);
        bVar4 = bVar5;
        if (local_80.next_offset == 0) {
          bVar4 = false;
        }
        ParameterInfo::~ParameterInfo(&local_80);
        bVar5 = bVar4;
      }
    } while (bVar4);
    return;
  }
  __assert_fail("parameter_start >= 512",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x88,"void C3DFile::readParameterSection(ifstream &)");
}

Assistant:

void C3DFile::readParameterSection (ifstream &datastream) {
	// locate the start of the parameter section
	int parameter_start = (header.first_parameter -1) * 512;
	assert (parameter_start >= 512);
	datastream.seekg (parameter_start);

  // first there is a small parameter header that we want to read
	ParameterHeader pheader;
	datastream.read(reinterpret_cast<char *>(&pheader), sizeof(ParameterHeader));
	//cout << (int)pheader.reserved_1 << "\t" << (int)pheader.reserved_2 << "\t" << (int)pheader.num_parameter_blocks << "\t" << (int)pheader.processor_type << endl;

	// then all parameters and groups follow
	Sint8 peek_buffer[2];

	int param_count = 0;
	int group_count = 0;

	bool read_param = true;
	while (read_param) {
		datastream.read(reinterpret_cast<char *>(peek_buffer), sizeof(Sint8) * 2);
		datastream.seekg(-2, ios::cur);

		if (peek_buffer[1] < 0) {
			GroupInfo group_info = readGroupInfo (datastream);
			//print_group_info(group_info);
		
			group_infos.push_back(group_info);

			// we insert the group id into the map so that we can easier get to the
			// group data once we have the group id.
			// Note: we have to insert the negative value as the group id is always
			// negative!
			group_id_to_index_map[-group_info.id] = group_infos.size() - 1;

			// cout << "inserting group " << group_info.name << " at " << static_cast<int>(group_info.id) << endl;

			group_count ++;
		} else {
			ParameterInfo param_info = readParameterInfo(datastream);
			//print_parameter_info(param_info);

			param_infos.push_back(param_info);
			param_count ++;
			if (param_info.next_offset == 0)
				read_param = false;
		}
	}
	/*
	cout << "current position = " << datastream.tellg() << endl;
	cout << "Read " << param_count << " parameters" << endl;
	cout << "Read " << group_count << " groups" << endl;
	*/
}